

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O3

void __thiscall binpac::FlowBuffer::set_eof(FlowBuffer *this)

{
  int iVar1;
  
  this->eof_ = true;
  if (this->chunked_ == false) {
    iVar1 = this->frame_length_;
  }
  else {
    iVar1 = *(int *)&this->orig_data_end_ - *(int *)&this->orig_data_begin_;
    this->frame_length_ = iVar1;
  }
  if (-1 < iVar1) {
    return;
  }
  this->frame_length_ = 0;
  return;
}

Assistant:

void FlowBuffer::set_eof()
	{
	// fprintf(stderr, "EOF\n");
	eof_ = true;
	if ( chunked_ )
		frame_length_ = orig_data_end_ - orig_data_begin_;
	if ( frame_length_ < 0 )
		frame_length_ = 0;
	}